

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

StringEq * __thiscall
wasm::Builder::makeStringEq(Builder *this,StringEqOp op,Expression *left,Expression *right)

{
  StringEq *this_00;
  
  this_00 = (StringEq *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)87>).super_Expression._id = StringEqId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)87>).super_Expression.type.id = 0;
  this_00->op = op;
  this_00->left = left;
  this_00->right = right;
  StringEq::finalize(this_00);
  return this_00;
}

Assistant:

StringEq* makeStringEq(StringEqOp op, Expression* left, Expression* right) {
    auto* ret = wasm.allocator.alloc<StringEq>();
    ret->op = op;
    ret->left = left;
    ret->right = right;
    ret->finalize();
    return ret;
  }